

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_u8x3.c
# Opt level: O2

void convolve(uint8_t *x,uint8_t *y,int sz,uint8_t *k,int ksz)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint8_t *puVar7;
  int j;
  ulong uVar8;
  uint uVar9;
  
  if ((ksz & 1U) == 0) {
    __assert_fail("(ksz&1)==1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/image_u8x3.c"
                  ,0xbb,"void convolve(const uint8_t *, uint8_t *, int, const uint8_t *, int)");
  }
  uVar1 = ksz / 2;
  uVar9 = sz;
  if ((int)uVar1 < sz) {
    uVar9 = uVar1;
  }
  uVar5 = 0;
  uVar4 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    y[uVar5] = x[uVar5];
  }
  uVar9 = sz - ksz;
  uVar5 = 0;
  uVar4 = (ulong)(uint)ksz;
  if (ksz < 1) {
    uVar4 = uVar5;
  }
  uVar6 = 0;
  puVar7 = x;
  if (0 < (int)uVar9) {
    uVar6 = (ulong)uVar9;
  }
  for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
    iVar3 = 0;
    for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
      iVar3 = iVar3 + (uint)puVar7[uVar8] * (uint)k[uVar8];
    }
    y[uVar5 + (long)(int)uVar1] = (uint8_t)((uint)iVar3 >> 8);
    puVar7 = puVar7 + 1;
  }
  for (lVar2 = (long)(int)(uVar9 + uVar1); lVar2 < sz; lVar2 = lVar2 + 1) {
    y[lVar2] = x[lVar2];
  }
  return;
}

Assistant:

static void convolve(const uint8_t *x, uint8_t *y, int sz, const uint8_t *k, int ksz)
{
    assert((ksz&1)==1);

    for (int i = 0; i < ksz/2 && i < sz; i++)
        y[i] = x[i];

    for (int i = 0; i < sz - ksz; i++) {
        uint32_t acc = 0;

        for (int j = 0; j < ksz; j++)
            acc += k[j]*x[i+j];

        y[ksz/2 + i] = acc >> 8;
    }

    for (int i = sz - ksz + ksz/2; i < sz; i++)
        y[i] = x[i];
}